

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

Vec_Int_t * Sbc_ManWlcNodes2(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGiaLits)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *__s;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  size_t __nmemb;
  int iVar15;
  uint uVar16;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  iVar10 = p->nObjs;
  iVar12 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar12 = iVar10;
  }
  if (iVar12 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar12 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0xff,(long)iVar10 * 4);
  }
  iVar12 = vGiaLits->nSize;
  if (0 < (long)iVar12) {
    piVar5 = vGiaLits->pArray;
    lVar8 = 0;
    do {
      uVar16 = *(uint *)((long)piVar5 + lVar8 * 2);
      if (uVar16 != 0xffffffff) {
        if ((int)uVar16 < 0) {
LAB_0035bc73:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (iVar10 <= (int)(uVar16 >> 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(uint *)((long)__s + (ulong)(uVar16 >> 1) * 4) = (uVar16 & 1) + (int)lVar8;
      }
      lVar8 = lVar8 + 2;
    } while ((long)iVar12 * 2 != lVar8);
  }
  if (1 < pNtk->iObj) {
    uVar13 = 1;
    do {
      if ((long)pNtk->nObjsAlloc <= (long)uVar13) goto LAB_0035bcef;
      if ((long)(pNtk->vCopies).nSize <= (long)uVar13) goto LAB_0035bc54;
      pWVar2 = pNtk->pObjs;
      iVar12 = (pNtk->vCopies).pArray[uVar13];
      iVar3 = pWVar2[uVar13].End - pWVar2[uVar13].Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      uVar11 = 0;
      do {
        if ((iVar12 < 0) || (lVar8 = uVar11 + (long)iVar12, (pNtk->vBits).nSize <= lVar8))
        goto LAB_0035bc54;
        uVar16 = (pNtk->vBits).pArray[lVar8];
        if ((int)uVar16 < 0) goto LAB_0035bc73;
        uVar4 = uVar16 >> 1;
        if (iVar10 <= (int)uVar4) goto LAB_0035bc54;
        uVar1 = *(uint *)((long)__s + (ulong)uVar4 * 4);
        if (uVar1 != 0xffffffff) {
          *(undefined4 *)((long)__s + (ulong)uVar4 * 4) = 0xffffffff;
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pcVar6 = Wlc_ObjName(pNtk,(int)((long)pWVar2 + (uVar13 * 0x18 - (long)pNtk->pObjs) >> 3) *
                                    -0x55555555);
          printf("Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n",
                 (ulong)(uVar1 >> 1),(ulong)((uVar16 ^ uVar1) & 1),uVar13 & 0xffffffff,pcVar6,
                 uVar11 & 0xffffffff,iVar15 + 1U);
          if (0 < (long)p_00->nSize) {
            lVar8 = 0;
            do {
              if (uVar13 == (uint)p_00->pArray[lVar8]) goto LAB_0035ba7f;
              lVar8 = lVar8 + 1;
            } while (p_00->nSize != lVar8);
          }
          Vec_IntPush(p_00,(int)uVar13);
        }
LAB_0035ba7f:
        uVar11 = uVar11 + 1;
      } while (uVar11 != iVar15 + 1U);
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)pNtk->iObj);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  piVar5 = p_00->pArray;
  __nmemb = (size_t)p_00->nSize;
  qsort(piVar5,__nmemb,4,Vec_IntSortCompare1);
  if ((long)__nmemb < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar16 = piVar5[__nmemb - 1];
  lVar8 = (long)(int)uVar16;
  if ((0 < lVar8) && ((int)uVar16 < pNtk->nObjsAlloc)) {
    if ((int)uVar16 < (pNtk->vCopies).nSize) {
      uVar4 = (pNtk->vCopies).pArray[lVar8];
      iVar12 = pNtk->pObjs[lVar8].Beg - pNtk->pObjs[lVar8].End;
      pcVar6 = Wlc_ObjName(pNtk,uVar16);
      printf("Considering object %d (%s):\n",(ulong)uVar16,pcVar6);
      iVar10 = -iVar12;
      if (0 < iVar12) {
        iVar10 = iVar12;
      }
      uVar13 = 0;
      while ((-1 < (int)uVar4 && (lVar8 = uVar4 + uVar13, (int)lVar8 < (pNtk->vBits).nSize))) {
        uVar16 = (pNtk->vBits).pArray[lVar8];
        uVar11 = (ulong)vGiaLits->nSize;
        uVar9 = 0xffffffff;
        if (0 < (long)uVar11) {
          uVar7 = 0;
          do {
            if (vGiaLits->pArray[uVar7] == uVar16) {
              uVar9 = uVar7 & 0xffffffff;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
        if ((int)uVar16 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        uVar7 = 0xffffffff;
        if (0 < vGiaLits->nSize) {
          uVar14 = 0;
          do {
            if ((vGiaLits->pArray[uVar14] ^ uVar16) == 1) {
              uVar7 = uVar14 & 0xffffffff;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        printf("Matching bit %d with output %d / %d.\n",uVar13 & 0xffffffff,uVar9,uVar7);
        uVar16 = (uVar16 >> 1) * p->nSimWords;
        if (((int)uVar16 < 0) || (p->vSims->nSize <= (int)uVar16)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        Extra_PrintHex(_stdout,(uint *)(p->vSims->pArray + uVar16),6);
        putchar(10);
        uVar13 = uVar13 + 1;
        if (uVar13 == iVar10 + 1) {
          return p_00;
        }
      }
    }
LAB_0035bc54:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_0035bcef:
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

Vec_Int_t * Sbc_ManWlcNodes2( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGiaLits )
{
    Wlc_Obj_t * pObj;  int i, k, iGiaLit, iFirst, nBits;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vGiaLits, iGiaLit, i )
        if ( iGiaLit != -1 )
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iGiaLit), Abc_Var2Lit(i, Abc_LitIsCompl(iGiaLit)) );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        for ( k = 0; k < nBits; k++ )
        {
            int iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            int iLitOut = Vec_IntEntry( vMap, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLitGia), -1 );
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n", Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut), i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits );
            Vec_IntPushUnique( vRes, i );
        }
    }
    Vec_IntFree( vMap );
    Vec_IntSort( vRes, 0 );
    // consider the last one
    pObj   = Wlc_NtkObj( pNtk, Vec_IntEntryLast(vRes) );
    iFirst = Vec_IntEntry( &pNtk->vCopies, Wlc_ObjId(pNtk, pObj) );
    nBits  = Wlc_ObjRange(pObj);
    printf( "Considering object %d (%s):\n", Wlc_ObjId(pNtk, pObj), Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLitGia  = Vec_IntEntry( &pNtk->vBits, iFirst + k );
        int iLitOutP = Vec_IntFind( vGiaLits, iLitGia );
        int iLitOutN = Vec_IntFind( vGiaLits, Abc_LitNot(iLitGia) );
        printf( "Matching bit %d with output %d / %d.\n", k, iLitOutP, iLitOutN );
        // print simulation signature
        {
            word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
            Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
        }
    }
    return vRes;
}